

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void __thiscall duckdb::Event::Finish(Event *this)

{
  pointer pwVar1;
  Event *this_00;
  pointer pwVar2;
  shared_ptr<duckdb::Event,_true> parent;
  shared_ptr<duckdb::Event,_true> local_38;
  
  (*this->_vptr_Event[3])();
  LOCK();
  (this->finished)._M_base._M_i = true;
  UNLOCK();
  pwVar1 = (this->parents).
           super_vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
           .
           super__Vector_base<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar2 = (this->parents).
                super_vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
                .
                super__Vector_base<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pwVar2 != pwVar1; pwVar2 = pwVar2 + 1) {
    weak_ptr<duckdb::Event,_true>::lock((weak_ptr<duckdb::Event,_true> *)&local_38);
    if (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_00 = shared_ptr<duckdb::Event,_true>::operator->(&local_38);
      CompleteDependency(this_00);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  (*this->_vptr_Event[4])(this);
  return;
}

Assistant:

void Event::Finish() {
	D_ASSERT(!finished);
	FinishEvent();
	finished = true;
	// finished processing the pipeline, now we can schedule pipelines that depend on this pipeline
	for (auto &parent_entry : parents) {
		auto parent = parent_entry.lock();
		if (!parent) { // LCOV_EXCL_START
			continue;
		} // LCOV_EXCL_STOP
		// mark a dependency as completed for each of the parents
		parent->CompleteDependency();
	}
	FinalizeFinish();
}